

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O2

int str_end_cmp(st_data_t ax,st_data_t ay)

{
  int iVar1;
  byte *pbVar2;
  st_str_end_key *y;
  st_str_end_key *x;
  byte *pbVar3;
  
  pbVar2 = *(byte **)ax;
  pbVar3 = *(byte **)ay;
  if ((long)*(byte **)(ax + 8) - (long)pbVar2 == *(long *)(ay + 8) - (long)pbVar3) {
    while( true ) {
      if (*(byte **)(ax + 8) <= pbVar2) {
        return 0;
      }
      iVar1 = (uint)*pbVar2 - (uint)*pbVar3;
      if (iVar1 != 0) break;
      pbVar2 = pbVar2 + 1;
      pbVar3 = pbVar3 + 1;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
str_end_cmp(st_data_t ax, st_data_t ay)
{
  st_str_end_key* x = (st_str_end_key* )ax;
  st_str_end_key* y = (st_str_end_key* )ay;
  UChar *p, *q;
  int c;

  if ((x->end - x->s) != (y->end - y->s))
    return 1;

  p = x->s;
  q = y->s;
  while (p < x->end) {
    c = (int )*p - (int )*q;
    if (c != 0) return c;

    p++; q++;
  }

  return 0;
}